

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_haxe_generator.cc
# Opt level: O2

string * __thiscall
t_haxe_generator::function_signature_normal_abi_cxx11_
          (string *__return_storage_ptr__,t_haxe_generator *this,t_function *tfunction)

{
  int iVar1;
  string resulttype;
  string arguments;
  string sStack_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  string local_38;
  
  argument_list_abi_cxx11_(&local_38,this,tfunction->arglist_);
  local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
  local_b8._M_string_length = 0;
  local_b8.field_2._M_local_buf[0] = '\0';
  if (tfunction->oneway_ == false) {
    iVar1 = (*(tfunction->returntype_->super_t_doc)._vptr_t_doc[4])();
    if ((char)iVar1 == '\0') {
      type_name_abi_cxx11_(&sStack_d8,this,tfunction->returntype_,false,false);
      std::__cxx11::string::operator=((string *)&local_b8,(string *)&sStack_d8);
      std::__cxx11::string::~string((string *)&sStack_d8);
      goto LAB_001e6401;
    }
  }
  std::__cxx11::string::assign((char *)&local_b8);
LAB_001e6401:
  std::operator+(&local_98,"function ",&tfunction->name_);
  std::operator+(&local_78,&local_98,"(");
  std::operator+(&local_58,&local_78,&local_38);
  std::operator+(&sStack_d8,&local_58,") : ");
  std::operator+(__return_storage_ptr__,&sStack_d8,&local_b8);
  std::__cxx11::string::~string((string *)&sStack_d8);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&local_b8);
  std::__cxx11::string::~string((string *)&local_38);
  return __return_storage_ptr__;
}

Assistant:

string t_haxe_generator::function_signature_normal(t_function* tfunction) {
  std::string arguments = argument_list(tfunction->get_arglist());

  std::string resulttype;
  if (tfunction->is_oneway() || tfunction->get_returntype()->is_void()) {
    resulttype = "Void";
  } else {
    resulttype = type_name(tfunction->get_returntype());
  }

  std::string result = "function " + tfunction->get_name() + "(" + arguments + ") : " + resulttype;
  return result;
}